

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  FieldOptions *this_00;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  uint8 *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.name");
    psVar2 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->extendee_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.extendee");
    psVar2 = (this->extendee_).ptr_;
    *target = 0x12;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar1 & 0x40) != 0) {
    uVar9 = (ulong)this->number_;
    pbVar6 = target + 1;
    *target = 0x18;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar10;
    target = pbVar6 + 1;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    uVar9 = (ulong)this->label_;
    pbVar6 = target + 1;
    *target = 0x20;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar10;
    target = pbVar6 + 1;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    uVar9 = (ulong)this->type_;
    pbVar6 = target + 1;
    *target = 0x28;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar10;
    target = pbVar6 + 1;
  }
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->type_name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.type_name");
    psVar2 = (this->type_name_).ptr_;
    *target = 0x32;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar1 & 8) != 0) {
    psVar2 = (this->default_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.default_value");
    psVar2 = (this->default_value_).ptr_;
    *target = 0x3a;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar1 & 0x20) != 0) {
    this_00 = this->options_;
    *target = 0x42;
    pbVar6 = target + 1;
    uVar8 = this_00->_cached_size_;
    uVar5 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar5;
    target = FieldOptions::InternalSerializeWithCachedSizesToArray(this_00,deterministic,pbVar6 + 1)
    ;
  }
  if ((char)uVar1 < '\0') {
    uVar9 = (ulong)this->oneof_index_;
    pbVar6 = target + 1;
    *target = 0x48;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar10;
    target = pbVar6 + 1;
  }
  if ((uVar1 & 0x10) != 0) {
    psVar2 = (this->json_name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.json_name");
    psVar2 = (this->json_name_).ptr_;
    *target = 0x52;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar7 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar7;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string extendee = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.extendee");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->extendee(), target);
  }

  // optional int32 number = 3;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // optional string type_name = 6;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.type_name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        6, this->type_name(), target);
  }

  // optional string default_value = 7;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.default_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        7, this->default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->options_, deterministic, target);
  }

  // optional int32 oneof_index = 9;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(9, this->oneof_index(), target);
  }

  // optional string json_name = 10;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->json_name().data(), this->json_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.json_name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        10, this->json_name(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}